

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O1

_func_void_void_ptr * __thiscall
base::internal::HookList<void_(*)(const_void_*)>::ExchangeSingular
          (HookList<void_(*)(const_void_*)> *this,_func_void_void_ptr *value)

{
  _func_void_void_ptr *p_Var1;
  __int_type_conflict _Var2;
  long lVar3;
  bool bVar4;
  SpinLockHolder local_28;
  SpinLockHolder l;
  
  local_28.lock_ = (SpinLock *)&hooklist_spinlock;
  LOCK();
  bVar4 = hooklist_spinlock == 0;
  if (bVar4) {
    hooklist_spinlock = 1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock((SpinLock *)&hooklist_spinlock);
  }
  p_Var1 = this->priv_data[7];
  this->priv_data[7] = value;
  _Var2 = 8;
  if ((value == (_func_void_void_ptr *)0x0) &&
     (_Var2 = (this->priv_end).super___atomic_base<unsigned_long>._M_i, _Var2 != 0)) {
    lVar3 = _Var2 << 0x20;
    do {
      lVar3 = lVar3 + -0x100000000;
      if (*(long *)((long)this->priv_data + (lVar3 >> 0x1d)) != 0) goto LAB_00120032;
      _Var2 = _Var2 - 1;
    } while (_Var2 != 0);
    _Var2 = 0;
  }
LAB_00120032:
  (this->priv_end).super___atomic_base<unsigned_long>._M_i = _Var2;
  SpinLockHolder::~SpinLockHolder(&local_28);
  return p_Var1;
}

Assistant:

T HookList<T>::ExchangeSingular(T value) {
  T old_value;
  SpinLockHolder l(&hooklist_spinlock);
  old_value = cast_priv_data(kHookListSingularIdx)->load(std::memory_order_relaxed);
  cast_priv_data(kHookListSingularIdx)->store(value, std::memory_order_relaxed);
  if (value != T{}) {
    priv_end.store(kHookListSingularIdx + 1, std::memory_order_relaxed);
  } else {
    FixupPrivEndLocked();
  }
  return old_value;
}